

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall re2c::HeaderFile::~HeaderFile(HeaderFile *this)

{
  void *__ptr;
  size_t __n;
  string local_30 [8];
  string content;
  HeaderFile *this_local;
  
  content.field_2._8_8_ = this;
  if (this->file != (FILE *)0x0) {
    std::__cxx11::ostringstream::str();
    __ptr = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    fwrite(__ptr,1,__n,(FILE *)this->file);
    fclose((FILE *)this->file);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

HeaderFile::~HeaderFile ()
{
	if (file != NULL)
	{
		std::string content = stream.str ();
		fwrite (content.c_str (), 1, content.size (), file);
		fclose (file);
	}
}